

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::~IfcFaceSurface(IfcFaceSurface *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  
  *(undefined ***)&this[-1].super_IfcFace.field_0x50 = &PTR__IfcFaceSurface_00841a28;
  *(undefined ***)&(this->super_IfcFace).field_0x38 = &PTR__IfcFaceSurface_00841ac8;
  this[-1].SameSense._M_dataplus._M_p = (pointer)&PTR__IfcFaceSurface_00841a50;
  this[-1].SameSense.field_2._M_allocated_capacity = (size_type)&PTR__IfcFaceSurface_00841a78;
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceSurface_00841aa0;
  puVar2 = *(undefined1 **)
            &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x18;
  puVar1 = &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.field_0x28;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcFace.field_0x50 = 0x841ba0;
  *(undefined8 *)&(this->super_IfcFace).field_0x38 = 0x841c18;
  this[-1].SameSense._M_dataplus._M_p = (pointer)0x841bc8;
  this[-1].SameSense.field_2._M_allocated_capacity = 0x841bf0;
  pvVar3 = *(void **)&this[-1].field_0x80;
  if (pvVar3 != (void *)0x0) {
    operator_delete(pvVar3,*(long *)&this[-1].field_0x90 - (long)pvVar3);
  }
  operator_delete(&this[-1].super_IfcFace.field_0x50,0x98);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}